

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O2

int get_zeros_and_len_padding(uchar *input,size_t input_len,size_t *data_len)

{
  int iVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  
  iVar1 = -0x6100;
  if (data_len != (size_t *)0x0 && input != (uchar *)0x0) {
    uVar3 = (ulong)input[input_len - 1];
    *data_len = input_len - uVar3;
    bVar2 = input_len < uVar3 || uVar3 == 0;
    for (uVar4 = 0; input_len - 1 != uVar4; uVar4 = uVar4 + 1) {
      bVar5 = input[uVar4];
      if (uVar4 < input_len - uVar3) {
        bVar5 = 0;
      }
      bVar2 = bVar5 | bVar2;
    }
    iVar1 = -0x6200;
    if (bVar2 == 0) {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int get_zeros_and_len_padding( unsigned char *input, size_t input_len,
                                      size_t *data_len )
{
    size_t i, pad_idx;
    unsigned char padding_len, bad = 0;

    if( NULL == input || NULL == data_len )
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

    padding_len = input[input_len - 1];
    *data_len = input_len - padding_len;

    /* Avoid logical || since it results in a branch */
    bad |= padding_len > input_len;
    bad |= padding_len == 0;

    /* The number of bytes checked must be independent of padding_len */
    pad_idx = input_len - padding_len;
    for( i = 0; i < input_len - 1; i++ )
        bad |= input[i] * ( i >= pad_idx );

    return( MBEDTLS_ERR_CIPHER_INVALID_PADDING * ( bad != 0 ) );
}